

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O0

void __thiscall llbuild::basic::StringList::StringList(StringList *this,BinaryDecoder *decoder)

{
  char *pcVar1;
  size_t in_RCX;
  void *in_RDX;
  undefined1 local_38 [8];
  StringRef contents;
  BinaryDecoder *decoder_local;
  StringList *this_local;
  
  this->contents = (char *)0x0;
  this->size = 0;
  contents.Length = (size_t)decoder;
  BinaryDecoder::read(decoder,(int)this + 8,in_RDX,in_RCX);
  llvm::StringRef::StringRef((StringRef *)local_38);
  BinaryDecoder::readBytes((BinaryDecoder *)contents.Length,this->size,(StringRef *)local_38);
  pcVar1 = (char *)operator_new__(this->size);
  this->contents = pcVar1;
  memcpy(this->contents,(void *)local_38,(size_t)contents.Data);
  return;
}

Assistant:

StringList(basic::BinaryDecoder& decoder) {
    decoder.read(size);
    StringRef contents;
    decoder.readBytes(size, contents);
    this->contents = new char[size];
    memcpy(this->contents, contents.data(), contents.size());
  }